

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeTypedArrayPrototype
               (DynamicObject *typedarrayPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar3;
  JavascriptFunction *pJVar4;
  ScriptConfiguration *pSVar5;
  JavascriptFunction **ppJVar6;
  undefined4 *puVar7;
  JavascriptFunction *valuesFunc;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *typedarrayPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,typedarrayPrototype,mode,0x1f,0);
  this = RecyclableObject::GetScriptContext(&typedarrayPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&typedarrayPrototype->super_RecyclableObject);
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Array_prototype,this);
  }
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).typedArrayConstructor);
  AddMember(this_00,typedarrayPrototype,0x67,*ppRVar3);
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x19b,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Set,2,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x1cb,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::Subarray,2,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x51,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::At,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,99,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::CopyWithin,2,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x82,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Every,1
             ,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x88,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Fill,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x89,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Filter,
             1,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x8b,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Find,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x8c,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::FindIndex,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x93,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::ForEach
             ,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0xb9,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::IndexOf
             ,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0xcc,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Join,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0xd0,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::LastIndexOf,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0xd5,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Map,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,300,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Reduce,1
             ,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x12d,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::ReduceRight,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x136,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::Reverse,0,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x150,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Slice,
             2,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x151,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Some,1
             ,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x152,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Sort,1
             ,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0x7a,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Entries
             ,0,'\x06');
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0xcf,(FunctionInfo *)Js::TypedArrayBase::EntryInfo::Keys,0,
             '\x06');
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,typedarrayPrototype,399,
                      (FunctionInfo *)Js::TypedArrayBase::EntryInfo::Values,0,'\x06');
  AddMember(this_00,typedarrayPrototype,0x14,pJVar4);
  AddFunctionToLibraryObject
            (this_00,typedarrayPrototype,0xb8,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::Includes,1,'\x06');
  AddAccessorsToLibraryObject
            (this_00,typedarrayPrototype,0x1aa,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::GetterBuffer,(FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this_00,typedarrayPrototype,0x1a9,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::GetterByteLength,(FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this_00,typedarrayPrototype,0x1a8,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::GetterByteOffset,(FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this_00,typedarrayPrototype,0xd1,
             (FunctionInfo *)Js::TypedArrayBase::EntryInfo::GetterLength,(FunctionInfo *)0x0);
  pSVar5 = ScriptContext::GetConfig(this);
  bVar2 = ScriptConfiguration::IsES6ToStringTagEnabled(pSVar5);
  if (bVar2) {
    AddAccessorsToLibraryObjectWithName
              (this_00,typedarrayPrototype,0x1b,0x2c3,
               (FunctionInfo *)Js::TypedArrayBase::EntryInfo::GetterSymbolToStringTag,
               (FunctionInfo *)0x0);
  }
  ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this_00->arrayPrototypeToStringFunction);
  if (*ppJVar6 == (JavascriptFunction *)0x0) {
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToLocaleStringFunction);
    if (*ppJVar6 != (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x95a,
                                  "(library->arrayPrototypeToLocaleStringFunction == nullptr)",
                                  "library->arrayPrototypeToLocaleStringFunction == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJVar4 = AddFunctionToLibraryObject
                       (this_00,typedarrayPrototype,0x172,
                        (FunctionInfo *)Js::JavascriptArray::EntryInfo::ToLocaleString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
              (&this_00->arrayPrototypeToLocaleStringFunction,pJVar4);
    pJVar4 = AddFunctionToLibraryObject
                       (this_00,typedarrayPrototype,0x178,
                        (FunctionInfo *)Js::JavascriptArray::EntryInfo::ToString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
              (&this_00->arrayPrototypeToStringFunction,pJVar4);
  }
  else {
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToLocaleStringFunction);
    if (*ppJVar6 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x961,"(library->arrayPrototypeToLocaleStringFunction)",
                                  "library->arrayPrototypeToLocaleStringFunction");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToLocaleStringFunction);
    AddMember(this_00,typedarrayPrototype,0x172,*ppJVar6);
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToStringFunction);
    AddMember(this_00,typedarrayPrototype,0x178,*ppJVar6);
  }
  pSVar5 = ScriptContext::GetConfig(this);
  bVar2 = ScriptConfiguration::IsESArrayFindFromLastEnabled(pSVar5);
  if (bVar2) {
    AddFunctionToLibraryObject
              (this_00,typedarrayPrototype,0x8d,
               (FunctionInfo *)Js::TypedArrayBase::EntryInfo::FindLast,1,'\x06');
    AddFunctionToLibraryObject
              (this_00,typedarrayPrototype,0x8e,
               (FunctionInfo *)Js::TypedArrayBase::EntryInfo::FindLastIndex,1,'\x06');
  }
  DynamicObject::SetHasNoEnumerableProperties(typedarrayPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeTypedArrayPrototype(DynamicObject* typedarrayPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(typedarrayPrototype, mode, 31);

        ScriptContext* scriptContext = typedarrayPrototype->GetScriptContext();
        JavascriptLibrary* library = typedarrayPrototype->GetLibrary();

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
        }
#endif

        library->AddMember(typedarrayPrototype, PropertyIds::constructor, library->typedArrayConstructor);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::set, &TypedArrayBase::EntryInfo::Set, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::subarray, &TypedArrayBase::EntryInfo::Subarray, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::at, &TypedArrayBase::EntryInfo::At, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::copyWithin, &TypedArrayBase::EntryInfo::CopyWithin, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::every, &TypedArrayBase::EntryInfo::Every, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::fill, &TypedArrayBase::EntryInfo::Fill, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::filter, &TypedArrayBase::EntryInfo::Filter, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::find, &TypedArrayBase::EntryInfo::Find, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findIndex, &TypedArrayBase::EntryInfo::FindIndex, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::forEach, &TypedArrayBase::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::indexOf, &TypedArrayBase::EntryInfo::IndexOf, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::join, &TypedArrayBase::EntryInfo::Join, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::lastIndexOf, &TypedArrayBase::EntryInfo::LastIndexOf, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::map, &TypedArrayBase::EntryInfo::Map, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reduce, &TypedArrayBase::EntryInfo::Reduce, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reduceRight, &TypedArrayBase::EntryInfo::ReduceRight, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reverse, &TypedArrayBase::EntryInfo::Reverse, 0);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::slice, &TypedArrayBase::EntryInfo::Slice, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::some, &TypedArrayBase::EntryInfo::Some, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::sort, &TypedArrayBase::EntryInfo::Sort, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::entries, &TypedArrayBase::EntryInfo::Entries, 0);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::keys, &TypedArrayBase::EntryInfo::Keys, 0);
        JavascriptFunction* valuesFunc = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::values, &TypedArrayBase::EntryInfo::Values, 0);
        library->AddMember(typedarrayPrototype, PropertyIds::_symbolIterator, valuesFunc);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::includes, &TypedArrayBase::EntryInfo::Includes, 1);

        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::buffer, &TypedArrayBase::EntryInfo::GetterBuffer, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::byteLength, &TypedArrayBase::EntryInfo::GetterByteLength, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::byteOffset, &TypedArrayBase::EntryInfo::GetterByteOffset, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::length, &TypedArrayBase::EntryInfo::GetterLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            // ES2017 22.2.3.32 get %TypedArray%.prototype[@@toStringTag]
            // %TypedArray%.prototype[@@toStringTag] is an accessor property whose set accessor function is undefined.
            // This property has the attributes { [[Enumerable]]: false, [[Configurable]]: true }.
            // The initial value of the name property of this function is "get [Symbol.toStringTag]".
            library->AddAccessorsToLibraryObjectWithName(typedarrayPrototype, PropertyIds::_symbolToStringTag,
                PropertyIds::_RuntimeFunctionNameId_toStringTag, &TypedArrayBase::EntryInfo::GetterSymbolToStringTag, nullptr);
        }
        // The toString and toLocaleString properties are shared between Array.prototype and %TypedArray%.prototype.
        // Whichever prototype is initialized first will create the functions, the other should just load the existing function objects.
        if (library->arrayPrototypeToStringFunction == nullptr)
        {
            Assert(library->arrayPrototypeToLocaleStringFunction == nullptr);

            library->arrayPrototypeToLocaleStringFunction = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::toLocaleString, &JavascriptArray::EntryInfo::ToLocaleString, 0);
            library->arrayPrototypeToStringFunction = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::toString, &JavascriptArray::EntryInfo::ToString, 0);
        }
        else
        {
            Assert(library->arrayPrototypeToLocaleStringFunction);

            library->AddMember(typedarrayPrototype, PropertyIds::toLocaleString, library->arrayPrototypeToLocaleStringFunction);
            library->AddMember(typedarrayPrototype, PropertyIds::toString, library->arrayPrototypeToStringFunction);
        }

        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled()) {
            library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findLast, &TypedArrayBase::EntryInfo::FindLast, 1);
            library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findLastIndex, &TypedArrayBase::EntryInfo::FindLastIndex, 1);
        }

        typedarrayPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }